

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimizer_engine.cpp
# Opt level: O0

uint32_t __thiscall ram::MinimizerEngine::Index::Find(Index *this,uint64_t key,uint64_t **dst)

{
  bool bVar1;
  pointer pvVar2;
  const_reference pvVar3;
  _Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_true> local_40;
  key_type local_38;
  _Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_true> local_30;
  const_iterator it;
  uint64_t **dst_local;
  uint64_t key_local;
  Index *this_local;
  
  local_38 = key << 1;
  it.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_true>._M_cur =
       (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_true>)
       (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_true>)dst;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_unsigned_long,_ram::MinimizerEngine::Index::Hash,_ram::MinimizerEngine::Index::KeyEqual,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
       ::find(&this->locator,&local_38);
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_unsigned_long,_ram::MinimizerEngine::Index::Hash,_ram::MinimizerEngine::Index::KeyEqual,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
       ::end(&this->locator);
  bVar1 = std::__detail::operator==(&local_30,&local_40);
  if (bVar1) {
    this_local._4_4_ = 0;
  }
  else {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_unsigned_long,_unsigned_long>,_false,_true>::
             operator->((_Node_const_iterator<std::pair<const_unsigned_long,_unsigned_long>,_false,_true>
                         *)&local_30);
    if ((pvVar2->first & 1) == 0) {
      pvVar2 = std::__detail::
               _Node_const_iterator<std::pair<const_unsigned_long,_unsigned_long>,_false,_true>::
               operator->((_Node_const_iterator<std::pair<const_unsigned_long,_unsigned_long>,_false,_true>
                           *)&local_30);
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->origins,pvVar2->second >> 0x20);
      *(const_reference *)
       it.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_true>._M_cur =
           pvVar3;
      pvVar2 = std::__detail::
               _Node_const_iterator<std::pair<const_unsigned_long,_unsigned_long>,_false,_true>::
               operator->((_Node_const_iterator<std::pair<const_unsigned_long,_unsigned_long>,_false,_true>
                           *)&local_30);
      this_local._4_4_ = (uint32_t)pvVar2->second;
    }
    else {
      pvVar2 = std::__detail::
               _Node_const_iterator<std::pair<const_unsigned_long,_unsigned_long>,_false,_true>::
               operator->((_Node_const_iterator<std::pair<const_unsigned_long,_unsigned_long>,_false,_true>
                           *)&local_30);
      *(unsigned_long **)
       it.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_true>._M_cur =
           &pvVar2->second;
      this_local._4_4_ = 1;
    }
  }
  return this_local._4_4_;
}

Assistant:

std::uint32_t MinimizerEngine::Index::Find(
    std::uint64_t key,
    const std::uint64_t** dst) const {
  auto it = locator.find(key << 1);
  if (it == locator.end()) {
    return 0;
  }
  if (it->first & 1) {
    *dst = &(it->second);
    return 1;
  }
  *dst = &(origins[it->second >> 32]);
  return static_cast<std::uint32_t>(it->second);
}